

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

_Bool ignore_tval(wchar_t tval)

{
  tval_desc *ptVar1;
  ulong uVar2;
  _Bool _Var3;
  
  _Var3 = true;
  ptVar1 = sval_dependent;
  uVar2 = 0;
  while ((kb_info[tval].num_svals == 0 || (ptVar1->tval != tval))) {
    _Var3 = uVar2 < 0x10;
    uVar2 = uVar2 + 1;
    ptVar1 = ptVar1 + 1;
    if (uVar2 == 0x11) {
      return _Var3;
    }
  }
  return _Var3;
}

Assistant:

bool ignore_tval(int tval)
{
	size_t i;

	/* Only ignore if the tval's allowed */
	for (i = 0; i < N_ELEMENTS(sval_dependent); i++) {
		if (kb_info[tval].num_svals == 0) continue;
		if (tval == sval_dependent[i].tval)
			return true;
	}

	return false;
}